

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_Boolean UA_NodeId_isNull(UA_NodeId *p)

{
  if (p->namespaceIndex == 0) {
    if (p->identifierType != UA_NODEIDTYPE_GUID) {
      if (p->identifierType == UA_NODEIDTYPE_NUMERIC) {
        return (p->identifier).numeric == 0;
      }
      return (p->identifier).string.length == 0;
    }
    if (((((((p->identifier).numeric == 0) && ((p->identifier).guid.data2 == 0)) &&
          ((p->identifier).guid.data3 == 0)) &&
         (((p->identifier).guid.data4[0] == '\0' && ((p->identifier).guid.data4[1] == '\0')))) &&
        (((p->identifier).guid.data4[2] == '\0' &&
         (((p->identifier).guid.data4[3] == '\0' && ((p->identifier).guid.data4[4] == '\0')))))) &&
       (((p->identifier).guid.data4[5] == '\0' && ((p->identifier).guid.data4[6] == '\0')))) {
      return (p->identifier).guid.data4[7] == '\0';
    }
  }
  return false;
}

Assistant:

UA_Boolean
UA_NodeId_isNull(const UA_NodeId *p) {
    if(p->namespaceIndex != 0)
        return false;
    switch(p->identifierType) {
    case UA_NODEIDTYPE_NUMERIC:
        return (p->identifier.numeric == 0);
    case UA_NODEIDTYPE_GUID:
        return (p->identifier.guid.data1 == 0 &&
                p->identifier.guid.data2 == 0 &&
                p->identifier.guid.data3 == 0 &&
                p->identifier.guid.data4[0] == 0 &&
                p->identifier.guid.data4[1] == 0 &&
                p->identifier.guid.data4[2] == 0 &&
                p->identifier.guid.data4[3] == 0 &&
                p->identifier.guid.data4[4] == 0 &&
                p->identifier.guid.data4[5] == 0 &&
                p->identifier.guid.data4[6] == 0 &&
                p->identifier.guid.data4[7] == 0);
    default:
        break;
    }
    return (p->identifier.string.length == 0);
}